

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

int32 fread_retry(void *pointer,int32 size,int32 num_items,FILE *stream)

{
  size_t sVar1;
  int local_48;
  int local_44;
  int32 loc;
  uint32 n_retry_rem;
  size_t n_items_rem;
  size_t n_items_read;
  char *data;
  FILE *stream_local;
  int32 num_items_local;
  int32 size_local;
  void *pointer_local;
  
  local_44 = 0x3c;
  local_48 = 0;
  _loc = (size_t)num_items;
  do {
    sVar1 = fread((void *)((long)pointer + (long)local_48),(long)size,_loc,(FILE *)stream);
    _loc = _loc - sVar1;
    if (_loc != 0) {
      if (local_44 == 0) {
        return -1;
      }
      if (local_44 == 0x3c) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                       ,0x1b3,"fread() failed; retrying...\n");
      }
      local_44 = local_44 + -1;
      local_48 = local_48 + (int)sVar1 * size;
      sleep(1);
    }
  } while (_loc != 0);
  return num_items;
}

Assistant:

int32
fread_retry(void *pointer, int32 size, int32 num_items, FILE * stream)
{
    char *data;
    size_t n_items_read;
    size_t n_items_rem;
    uint32 n_retry_rem;
    int32 loc;

    n_retry_rem = FREAD_RETRY_COUNT;

    data = (char *)pointer;
    loc = 0;
    n_items_rem = num_items;

    do {
        n_items_read = fread(&data[loc], size, n_items_rem, stream);

        n_items_rem -= n_items_read;

        if (n_items_rem > 0) {
            /* an incomplete read occurred */

            if (n_retry_rem == 0)
                return -1;

            if (n_retry_rem == FREAD_RETRY_COUNT) {
                E_ERROR_SYSTEM("fread() failed; retrying...\n");
            }

            --n_retry_rem;

            loc += n_items_read * size;
#if !defined(_WIN32) && defined(HAVE_UNISTD_H)
            sleep(1);
#endif
        }
    } while (n_items_rem > 0);

    return num_items;
}